

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_19::StringBaseTextGenerator::~StringBaseTextGenerator
          (StringBaseTextGenerator *this)

{
  pointer pcVar1;
  
  (this->super_BaseTextGenerator)._vptr_BaseTextGenerator =
       (_func_int **)&PTR__StringBaseTextGenerator_00673700;
  pcVar1 = (this->output_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->output_).field_2) {
    operator_delete(pcVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

void Print(const char* text, size_t size) override {
    output_.append(text, size);
  }